

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CopyPtr.h
# Opt level: O0

CopyPtr<slang::SVQueue> * __thiscall
slang::CopyPtr<slang::SVQueue>::operator=
          (CopyPtr<slang::SVQueue> *this,CopyPtr<slang::SVQueue> *other)

{
  SVQueue *pSVar1;
  CopyPtr<slang::SVQueue> *other_local;
  CopyPtr<slang::SVQueue> *this_local;
  
  if (this != other) {
    pSVar1 = this->ptr;
    if (pSVar1 != (SVQueue *)0x0) {
      SVQueue::~SVQueue(pSVar1);
      operator_delete(pSVar1,0x58);
    }
    pSVar1 = (SVQueue *)operator_new(0x58);
    SVQueue::SVQueue(pSVar1,other->ptr);
    this->ptr = pSVar1;
  }
  return this;
}

Assistant:

CopyPtr& operator=(const CopyPtr& other) {
        if (this != &other) {
            delete ptr;
            ptr = new T(*other.ptr);
        }
        return *this;
    }